

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::remU(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  ulong uVar1;
  int iVar2;
  uintptr_t uVar3;
  
  uVar1 = (this->type).id;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  iVar2 = (int)uVar1;
  if (iVar2 == 3) {
    (__return_storage_ptr__->field_0).func.super_IString.str._M_len =
         (this->field_0).func.super_IString.str._M_len %
         (other->field_0).func.super_IString.str._M_len;
    uVar3 = 3;
  }
  else {
    if (iVar2 != 2) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x530);
    }
    (__return_storage_ptr__->field_0).i32 = (uint)(this->field_0).i32 % (uint)(other->field_0).i32;
    uVar3 = 2;
  }
  (__return_storage_ptr__->type).id = uVar3;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::remU(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(uint32_t(i32) % uint32_t(other.i32));
    case Type::i64:
      return Literal(uint64_t(i64) % uint64_t(other.i64));
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}